

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

int __thiscall mpt::client::dispatch(client *this,event *ev)

{
  int iVar1;
  ssize_t sVar2;
  iovec *__nbytes;
  msgtype local_42;
  int ret;
  msgtype mt;
  message msg;
  event *ev_local;
  client *this_local;
  
  if (ev == (event *)0x0) {
    this_local._4_4_ = 0;
  }
  else if (ev->msg == (message *)0x0) {
    this_local._4_4_ = (*(this->super_metatype).super_convertable._vptr_convertable[5])(this,0);
  }
  else {
    _ret = ev->msg->used;
    __nbytes = ev->msg->cont;
    msgtype::msgtype(&local_42,0,0);
    sVar2 = message::read((message *)&ret,2,&local_42,(size_t)__nbytes);
    if ((sVar2 == 0) || (local_42.cmd == '\x04')) {
      iVar1 = mpt_client_command(this,&ret,(int)local_42.arg);
      if (iVar1 < 0) {
        mpt_context_reply(ev->reply,iVar1,"%s","command message dispatch failed");
        ev->id = 0;
        this_local._4_4_ = 3;
      }
      else {
        if (ev->reply != (reply_context *)0x0) {
          mpt_context_reply(ev->reply,0,"%s","command message dispatched");
        }
        this_local._4_4_ = 0;
      }
    }
    else {
      mpt_context_reply(ev->reply,0xfffffffd,"%s (%02x)","bad message type",local_42.cmd);
      ev->id = 0;
      this_local._4_4_ = 3;
    }
  }
  return this_local._4_4_;
}

Assistant:

int client::dispatch(event *ev)
{
	if (!ev) {
		return 0;
	}
	if (!ev->msg) {
		return process(0);
	}
	message msg = *ev->msg;
	
	msgtype mt;
	if (msg.read(sizeof(mt), &mt) > 0
	 && mt.cmd != msgtype::Command) {
		mpt_context_reply(ev->reply, MPT_ERROR(BadType), "%s (%02x)", MPT_tr("bad message type"), mt.cmd);
		ev->id = 0;
		return ev->Fail | ev->Default;
	}
	int ret = mpt_client_command(this, &msg, mt.arg);
	if (ret < 0) {
		mpt_context_reply(ev->reply, ret, "%s", MPT_tr("command message dispatch failed"));
		ev->id = 0;
		return ev->Fail | ev->Default;
	}
	if (ev->reply) {
		mpt_context_reply(ev->reply, 0, "%s", MPT_tr("command message dispatched"));
	}
	return ev->None;
}